

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::init(PointSizeCase *this,EVP_PKEY_CTX *ctx)

{
  _Alloc_hider _Var1;
  bool bVar2;
  char cVar3;
  ContextType ctxType;
  uint uVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  ShaderProgram *this_00;
  NotSupportedError *pNVar7;
  TestError *this_01;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  byte bVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExtensions;
  int requiredSize;
  float aliasedSizeRange [2];
  ostringstream extensionList;
  size_type __dnew_4;
  size_type __dnew;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f0 [8];
  value_type local_2e8;
  string local_2c8;
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [5];
  ios_base local_238 [8];
  ios_base local_230 [264];
  string local_128;
  ContextType local_104;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  local_338._0_8_ = (pointer)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_338._16_8_ = (pointer)0x0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  uVar4 = this->m_flags;
  if ((uVar4 & 0x1e) != 0 && !bVar2) {
    local_100._0_8_ = (pointer)0x1a;
    local_2a8 = (undefined1  [8])(local_2a0 + 8);
    local_2a8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2a8,(ulong)local_100);
    local_2a0._8_8_ = local_100._0_8_;
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_2a8 + 8))->m_log + 2),"sellatio",8);
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_2a8 + 0x10))->m_log + 2),"n_shader",8);
    ((TestLog *)local_2a8)->m_log = (qpTestLog *)0x745f5458455f4c47;
    ((TestLog *)((long)local_2a8 + 8))->m_log = (qpTestLog *)0x74616c6c65737365;
    local_2a0._0_8_ = local_100._0_8_;
    *(char *)(local_100._0_8_ + (long)&((TestLog *)local_2a8)->m_log) = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    if (local_2a8 != (undefined1  [8])(local_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(local_2a0._8_8_ + 1));
    }
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0xe) != 0) {
    local_100._0_8_ = (pointer)0x1e;
    local_2a8 = (undefined1  [8])(local_2a0 + 8);
    local_2a8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2a8,(ulong)local_100);
    local_2a0._8_8_ = local_100._0_8_;
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_2a8 + 8))->m_log + 6),"ation_po",8);
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_2a8 + 0x10))->m_log + 6),"int_size",8);
    ((TestLog *)local_2a8)->m_log = (qpTestLog *)0x745f5458455f4c47;
    ((TestLog *)((long)local_2a8 + 8))->m_log = (qpTestLog *)0x74616c6c65737365;
    local_2a0._0_8_ = local_100._0_8_;
    *(char *)(local_100._0_8_ + (long)&((TestLog *)local_2a8)->m_log) = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    if (local_2a8 != (undefined1  [8])(local_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(local_2a0._8_8_ + 1));
    }
    uVar4 = this->m_flags;
  }
  if (!bVar2 && (uVar4 & 0xe0) != 0) {
    local_100._0_8_ = &DAT_00000016;
    local_2a8 = (undefined1  [8])(local_2a0 + 8);
    local_2a8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2a8,(ulong)local_100);
    local_2a0._8_8_ = local_100._0_8_;
    ((TestLog *)local_2a8)->m_log = (qpTestLog *)0x675f5458455f4c47;
    ((TestLog *)((long)local_2a8 + 8))->m_log = (qpTestLog *)0x5f797274656d6f65;
    *(undefined8 *)((long)&((TestLog *)((long)local_2a8 + 8))->m_log + 6) = 0x7265646168735f79;
    local_2a0._0_8_ = local_100._0_8_;
    *(char *)(local_100._0_8_ + (long)&((TestLog *)local_2a8)->m_log) = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    if (local_2a8 != (undefined1  [8])(local_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(local_2a0._8_8_ + 1));
    }
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0x60) != 0) {
    local_100._0_8_ = (pointer)0x1a;
    local_2a8 = (undefined1  [8])(local_2a0 + 8);
    local_2a8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_2a8,(ulong)local_100);
    local_2a0._8_8_ = local_100._0_8_;
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_2a8 + 8))->m_log + 2),"metry_po",8);
    builtin_strncpy((char *)((long)&((TestLog *)((long)local_2a8 + 0x10))->m_log + 2),"int_size",8);
    ((TestLog *)local_2a8)->m_log = (qpTestLog *)0x675f5458455f4c47;
    ((TestLog *)((long)local_2a8 + 8))->m_log = (qpTestLog *)0x5f797274656d6f65;
    local_2a0._0_8_ = local_100._0_8_;
    *(char *)(local_100._0_8_ + (long)&((TestLog *)local_2a8)->m_log) = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    if (local_2a8 != (undefined1  [8])(local_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(local_2a0._8_8_ + 1));
    }
  }
  if (0 < (int)((ulong)(local_338._8_8_ - local_338._0_8_) >> 5)) {
    bVar10 = 1;
    lVar12 = 0;
    lVar14 = 0;
    do {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         *(char **)(local_338._0_8_ + lVar12));
      bVar10 = bVar10 & bVar2;
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar14 < (int)((ulong)(local_338._8_8_ - local_338._0_8_) >> 5));
    if (bVar10 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      if (0 < (int)((ulong)(local_338._8_8_ - local_338._0_8_) >> 5)) {
        lVar14 = 8;
        lVar12 = 0;
        do {
          if (lVar12 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a8,*(char **)(local_338._0_8_ + lVar14 + -8),
                     *(long *)(local_338._0_8_ + lVar14));
          lVar12 = lVar12 + 1;
          lVar14 = lVar14 + 0x20;
        } while (lVar12 < (int)((ulong)(local_338._8_8_ - local_338._0_8_) >> 5));
      }
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                     "Test requires {",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318)
      ;
      plVar8 = (long *)std::__cxx11::string::append(local_2f0);
      local_100._0_8_ = *plVar8;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_ ==
          pbVar9) {
        local_f0[0]._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
        local_f0[0]._M_string_length = plVar8[3];
        local_100._0_8_ = local_f0;
      }
      else {
        local_f0[0]._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      }
      local_100._8_8_ = plVar8[1];
      *plVar8 = (long)pbVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_100);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_338);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2f0 = (undefined1  [8])0x0;
  iVar6 = getExpectedPointSize((PointSizeCase *)(ulong)(uint)this->m_flags);
  local_318._0_4_ = iVar6;
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0x818))(0x846d);
  if ((float)local_2f0._4_4_ < (float)iVar6) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)local_100,(int *)local_318);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                   "Test requires point size ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)local_2a8);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar4 = this->m_flags;
  if ((uVar4 & 1) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"Setting point size in vertex shader to 2.0.",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 2) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,
               "Setting point size in tessellation control shader to 4.0. (And ignoring it in evaluation)."
               ,0x5a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 4) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"Setting point size in tessellation evaluation shader to 4.0.",
               0x3c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 8) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,
               "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0x10) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,
               "Not setting point size in tessellation evaluation shader (resulting in the default point size)."
               ,0x5f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0x20) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"Setting point size in geometry shader to 6.0.",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    uVar4 = this->m_flags;
  }
  cVar3 = (char)uVar4;
  if ((uVar4 & 0x40) != 0) {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,"Reading point size in geometry shader and adding 2.0.",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
    cVar3 = (char)this->m_flags;
  }
  if (cVar3 < '\0') {
    local_2a8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a0,
               "Not setting point size in geometry shader (resulting in the default point size).",
               0x50);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
    std::ios_base::~ios_base(local_230);
  }
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"${VERSION_DECL}\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"\tgl_Position = a_position;\n",0x1b);
  if ((this->m_flags & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tgl_PointSize = 2.0;\n",0x15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_2c8._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)local_338,(string *)local_318,(ContextType *)&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
  std::ios_base::~ios_base(local_238);
  local_2f0 = (undefined1  [8])((ulong)local_2f0 & 0xffffffff00000000);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,local_338._0_8_,
             (pointer)(local_338._0_8_ + (long)(_Alloc_hider *)local_338._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2f0 & 0xffffffff) * 0x18),&local_2e8);
  local_128._M_dataplus._M_p = (char *)0x6e;
  local_318._0_8_ = &local_308;
  __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_318,(ulong)&local_128);
  _Var1._M_p = local_128._M_dataplus._M_p;
  local_308._M_allocated_capacity = (size_type)local_128._M_dataplus._M_p;
  local_318._0_8_ = __dest;
  memcpy(__dest,
         "${VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
         ,0x6e);
  local_318._8_8_ = _Var1._M_p;
  __dest->_M_local_buf[(long)_Var1._M_p] = '\0';
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_128._M_dataplus._M_p._0_4_ = iVar5;
  specializeShader(&local_2c8,(string *)local_318,(ContextType *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
  }
  local_2a8._0_4_ = 1;
  local_2a0._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,
             CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p),
             local_2c8._M_string_length +
             CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2a8 & 0xffffffff) * 0x18),(value_type *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != local_290) {
    operator_delete((void *)local_2a0._0_8_,local_290[0]._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p) !=
      &local_2c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p),
                    local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
  }
  uVar4 = this->m_flags;
  if ((uVar4 & 0x1e) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"${VERSION_DECL}\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"${EXTENSION_TESSELATION_SHADER}",0x1f);
    bVar2 = (this->m_flags & 0x10) == 0;
    pcVar13 = glcts::fixed_sample_locations_values + 1;
    pcVar11 = glcts::fixed_sample_locations_values + 1;
    if (bVar2) {
      pcVar11 = "#extension GL_EXT_tessellation_point_size : require\n";
    }
    lVar12 = 0x34;
    if (!bVar2) {
      lVar12 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,pcVar11,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"layout(vertices = 1) out;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"void main ()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tgl_TessLevelOuter[0] = 3.0;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tgl_TessLevelOuter[1] = 3.0;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tgl_TessLevelOuter[2] = 3.0;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tgl_TessLevelInner[0] = 3.0;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,
               "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",0x4b)
    ;
    if ((this->m_flags & 8U) == 0) {
      if ((this->m_flags & 2U) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"\t// thrown away\n",0x10);
        lVar12 = 0x2d;
        pcVar11 = "\tgl_out[gl_InvocationID].gl_PointSize = 4.0;\n";
        goto LAB_0159fbf2;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"\t// pass as is to eval\n",0x17);
      lVar12 = 0x4d;
      pcVar11 = "\tgl_out[gl_InvocationID].gl_PointSize = gl_in[gl_InvocationID].gl_PointSize;\n";
LAB_0159fbf2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,pcVar11,lVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"}\n",2);
    std::__cxx11::stringbuf::str();
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    local_338._0_4_ = iVar5;
    specializeShader(&local_2c8,(string *)local_318,(ContextType *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._0_8_ != &local_308) {
      operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
    std::ios_base::~ios_base(local_238);
    local_2f0._0_4_ = 3;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,
               CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p),
               local_2c8._M_string_length +
               CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + ((ulong)local_2f0 & 0xffffffff) * 0x18),&local_2e8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"${VERSION_DECL}\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"${EXTENSION_TESSELATION_SHADER}",0x1f);
    bVar2 = (this->m_flags & 0x10) == 0;
    if (bVar2) {
      pcVar13 = "#extension GL_EXT_tessellation_point_size : require\n";
    }
    lVar12 = 0x34;
    if (!bVar2) {
      lVar12 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,pcVar13,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"layout(triangles, point_mode) in;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"void main ()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\t// hide all but one vertex\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tif (gl_TessCoord.x < 0.99)\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\t\tgl_Position = vec4(-2.0, 0.0, 0.0, 1.0);\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\telse\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\t\tgl_Position = gl_in[0].gl_Position;\n",0x26);
    if ((this->m_flags & 8U) == 0) {
      if ((this->m_flags & 4U) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"\t// set point size\n",0x13);
        lVar12 = 0x15;
        pcVar11 = "\tgl_PointSize = 4.0;\n";
        goto LAB_0159fe80;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"\t// add to point size\n",0x16);
      lVar12 = 0x2d;
      pcVar11 = "\tgl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
LAB_0159fe80:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,pcVar11,lVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"}\n",2);
    std::__cxx11::stringbuf::str();
    local_104.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    specializeShader(&local_128,(string *)local_338,&local_104);
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
    std::ios_base::~ios_base(local_238);
    local_318._0_4_ = 4;
    local_318._8_8_ = local_308._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_318 + 8),local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (local_318._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_318 + 8)
               );
    if ((char *)local_318._8_8_ != local_308._M_local_buf + 8) {
      operator_delete((void *)local_318._8_8_,local_308._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p) !=
        &local_2c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2c8._M_dataplus._M_p._4_4_,(int)local_2c8._M_dataplus._M_p),
                      local_2c8.field_2._M_allocated_capacity + 1);
    }
    uVar4 = this->m_flags;
  }
  if ((uVar4 & 0xe0) == 0) goto LAB_015a0258;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"${VERSION_DECL}\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"${EXTENSION_GEOMETRY_SHADER}",0x1c);
  bVar2 = -1 < (char)this->m_flags;
  pcVar11 = glcts::fixed_sample_locations_values + 1;
  if (bVar2) {
    pcVar11 = "#extension GL_EXT_geometry_point_size : require\n";
  }
  lVar12 = 0x30;
  if (!bVar2) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,pcVar11,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"layout (points) in;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2a8,"layout (points, max_vertices=1) out;\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"{\n",2);
  uVar4 = this->m_flags;
  if ((uVar4 & 0x20) == 0) {
    if ((uVar4 & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2a8,"\tgl_Position = gl_in[0].gl_Position;\n",0x25);
      lVar12 = 0x2d;
      pcVar11 = "\tgl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
      goto LAB_015a0132;
    }
    if ((char)uVar4 < '\0') {
      lVar12 = 0x25;
      pcVar11 = "\tgl_Position = gl_in[0].gl_Position;\n";
      goto LAB_015a0132;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2a8,"\tgl_Position = gl_in[0].gl_Position;\n",0x25);
    lVar12 = 0x15;
    pcVar11 = "\tgl_PointSize = 6.0;\n";
LAB_015a0132:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,pcVar11,lVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"\tEmitVertex();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_2c8._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)local_338,(string *)local_318,(ContextType *)&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
  std::ios_base::~ios_base(local_238);
  local_2f0._0_4_ = 2;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,local_338._0_8_,
             (pointer)(local_338._0_8_ + (long)(_Alloc_hider *)local_338._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_2f0 & 0xffffffff) * 0x18),&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
  }
LAB_015a0258:
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,(ProgramSources *)local_100);
  this->m_program = this_00;
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_00);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar12 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  local_2a8 = (undefined1  [8])(local_2a0 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"failed to build program","");
  tcu::TestError::TestError(this_01,(string *)local_2a8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PointSizeCase::init (void)
{
	checkExtensions();
	checkPointSizeRequirements();

	// log

	if (m_flags & FLAG_VERTEX_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_CONTROL_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in tessellation control shader to 4.0. (And ignoring it in evaluation)." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_EVALUATION_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_ADD)
		m_testCtx.getLog() << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_TESSELLATION_DONT_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Not setting point size in tessellation evaluation shader (resulting in the default point size)." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_ADD)
		m_testCtx.getLog() << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	if (m_flags & FLAG_GEOMETRY_DONT_SET)
		m_testCtx.getLog() << tcu::TestLog::Message << "Not setting point size in geometry shader (resulting in the default point size)." << tcu::TestLog::EndMessage;

	// program

	{
		glu::ProgramSources sources;
		sources	<< glu::VertexSource(genVertexSource())
				<< glu::FragmentSource(genFragmentSource());

		if (m_flags & (FLAG_TESSELLATION_CONTROL_SET | FLAG_TESSELLATION_EVALUATION_SET | FLAG_TESSELLATION_ADD | FLAG_TESSELLATION_DONT_SET))
			sources << glu::TessellationControlSource(genTessellationControlSource())
					<< glu::TessellationEvaluationSource(genTessellationEvaluationSource());

		if (m_flags & (FLAG_GEOMETRY_SET | FLAG_GEOMETRY_ADD | FLAG_GEOMETRY_DONT_SET))
			sources << glu::GeometrySource(genGeometrySource());

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), sources);

		m_testCtx.getLog() << *m_program;
		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}
}